

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void clearSelect(sqlite3 *db,Select *p,int bFree)

{
  Select *pSVar1;
  Window *pWVar2;
  Window *pWVar3;
  bool bVar4;
  
  if (p != (Select *)0x0) {
    bVar4 = bFree == 0;
    do {
      pSVar1 = p->pPrior;
      if (p->pEList != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pEList);
      }
      sqlite3SrcListDelete(db,p->pSrc);
      if (p->pWhere != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pWhere);
      }
      if (p->pGroupBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pGroupBy);
      }
      if (p->pHaving != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pHaving);
      }
      if (p->pOrderBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pOrderBy);
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pLimit);
      }
      if (p->pWith != (With *)0x0) {
        sqlite3WithDelete(db,p->pWith);
      }
      pWVar3 = p->pWinDefn;
      while (pWVar3 != (Window *)0x0) {
        pWVar2 = pWVar3->pNextWin;
        sqlite3WindowDelete(db,pWVar3);
        pWVar3 = pWVar2;
      }
      while (pWVar3 = p->pWin, pWVar3 != (Window *)0x0) {
        if (pWVar3->ppThis != (Window **)0x0) {
          *pWVar3->ppThis = pWVar3->pNextWin;
          if (pWVar3->pNextWin != (Window *)0x0) {
            pWVar3->pNextWin->ppThis = pWVar3->ppThis;
          }
          pWVar3->ppThis = (Window **)0x0;
        }
      }
      if (!bVar4) {
        sqlite3DbFreeNN(db,p);
      }
      bVar4 = false;
      p = pSVar1;
    } while (pSVar1 != (Select *)0x0);
  }
  return;
}

Assistant:

static void clearSelect(sqlite3 *db, Select *p, int bFree){
  while( p ){
    Select *pPrior = p->pPrior;
    sqlite3ExprListDelete(db, p->pEList);
    sqlite3SrcListDelete(db, p->pSrc);
    sqlite3ExprDelete(db, p->pWhere);
    sqlite3ExprListDelete(db, p->pGroupBy);
    sqlite3ExprDelete(db, p->pHaving);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pLimit);
    if( OK_IF_ALWAYS_TRUE(p->pWith) ) sqlite3WithDelete(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( OK_IF_ALWAYS_TRUE(p->pWinDefn) ){
      sqlite3WindowListDelete(db, p->pWinDefn);
    }
    while( p->pWin ){
      assert( p->pWin->ppThis==&p->pWin );
      sqlite3WindowUnlinkFromSelect(p->pWin);
    }
#endif
    if( bFree ) sqlite3DbFreeNN(db, p);
    p = pPrior;
    bFree = 1;
  }
}